

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tests.cpp
# Opt level: O2

void __thiscall net_tests::cnetaddr_serialize_v1::test_method(cnetaddr_serialize_v1 *this)

{
  long lVar1;
  DNSLookupFn dns_lookup_function;
  DNSLookupFn dns_lookup_function_00;
  bool bVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator pvVar4;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  Span<const_unsigned_char> s;
  const_string file_00;
  Span<const_unsigned_char> s_00;
  const_string file_01;
  Span<const_unsigned_char> s_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  Span<const_unsigned_char> s_02;
  const_string file_05;
  Span<const_unsigned_char> s_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  check_type cVar5;
  undefined8 in_stack_fffffffffffffd68;
  undefined8 in_stack_fffffffffffffd70;
  _Manager_type in_stack_fffffffffffffd78;
  _Invoker_type in_stack_fffffffffffffd80;
  char *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  allocator<char> local_1d9;
  assertion_result local_1d8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  local_170;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  local_120;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  SerParams ser_params;
  DataStream local_c8;
  undefined1 local_a0 [32];
  bool local_80;
  undefined1 local_78 [16];
  undefined1 *local_68;
  undefined8 local_60;
  CNetAddr addr;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CNetAddr::CNetAddr(&addr);
  local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.m_read_pos = 0;
  local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a0._0_8_ = &ser_params;
  ser_params.super_SerParams.enc = V1;
  ser_params.fmt = Network;
  local_a0._8_8_ = &addr;
  ParamsWrapper<CAddress::SerParams,_CNetAddr>::Serialize<DataStream>
            ((ParamsWrapper<CAddress::SerParams,_CNetAddr> *)local_a0,&local_c8);
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x150;
  file.m_begin = (iterator)&local_e0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_f0,msg);
  local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
  local_a0._0_8_ = &PTR__lazy_ostream_011480b0;
  local_a0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_a0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_f8 = "";
  s.m_data = local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_start + local_c8.m_read_pos;
  s.m_size = (long)local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)s.m_data;
  HexStr_abi_cxx11_((string *)local_78,s);
  pvVar3 = (iterator)0x2;
  pvVar4 = local_78;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[33]>
            (local_a0,&local_100,0x150,1,2,pvVar4,"HexStr(s)","00000000000000000000000000000000",
             "\"00000000000000000000000000000000\"");
  std::__cxx11::string::~string((string *)local_78);
  if (local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  local_c8.m_read_pos = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,"1.2.3.4",(allocator<char> *)&local_1d8);
  std::
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  ::function(&local_120,&g_dns_lookup_abi_cxx11_);
  dns_lookup_function.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffd70;
  dns_lookup_function.super__Function_base._M_functor._M_unused._M_object =
       (void *)in_stack_fffffffffffffd68;
  dns_lookup_function.super__Function_base._M_manager = in_stack_fffffffffffffd78;
  dns_lookup_function._M_invoker = in_stack_fffffffffffffd80;
  LookupHost((optional<CNetAddr> *)local_a0,(string *)local_78,false,dns_lookup_function);
  if (local_80 == false) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      std::__throw_bad_optional_access();
    }
  }
  else {
    CNetAddr::operator=(&addr,(CNetAddr *)local_a0);
    std::_Optional_payload_base<CNetAddr>::_M_reset((_Optional_payload_base<CNetAddr> *)local_a0);
    std::_Function_base::~_Function_base(&local_120.super__Function_base);
    std::__cxx11::string::~string((string *)local_78);
    local_a0._0_8_ = &ser_params;
    local_a0._8_8_ = &addr;
    ParamsWrapper<CAddress::SerParams,_CNetAddr>::Serialize<DataStream>
              ((ParamsWrapper<CAddress::SerParams,_CNetAddr> *)local_a0,&local_c8);
    local_130 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_128 = "";
    local_140 = &boost::unit_test::basic_cstring<char_const>::null;
    local_138 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x155;
    file_00.m_begin = (iterator)&local_130;
    msg_00.m_end = pvVar4;
    msg_00.m_begin = pvVar3;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_140,
               msg_00);
    local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
    local_a0._0_8_ = &PTR__lazy_ostream_011480b0;
    local_a0._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_a0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    local_150 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_148 = "";
    s_00.m_data = local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                  _M_impl.super__Vector_impl_data._M_start + local_c8.m_read_pos;
    s_00.m_size = (long)local_c8.vch.
                        super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
                        .super__Vector_impl_data._M_finish - (long)s_00.m_data;
    HexStr_abi_cxx11_((string *)local_78,s_00);
    pvVar3 = (iterator)0x2;
    pvVar4 = local_78;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[33]>
              (local_a0,&local_150,0x155,1,2,pvVar4,"HexStr(s)","00000000000000000000ffff01020304",
               "\"00000000000000000000ffff01020304\"");
    std::__cxx11::string::~string((string *)local_78);
    if (local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
           .super__Vector_impl_data._M_start;
    }
    local_c8.m_read_pos = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_78,"1a1b:2a2b:3a3b:4a4b:5a5b:6a6b:7a7b:8a8b",
               (allocator<char> *)&local_1d8);
    std::
    function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
    ::function(&local_170,&g_dns_lookup_abi_cxx11_);
    dns_lookup_function_00.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffd70;
    dns_lookup_function_00.super__Function_base._M_functor._M_unused._M_object =
         (void *)in_stack_fffffffffffffd68;
    dns_lookup_function_00.super__Function_base._M_manager = in_stack_fffffffffffffd78;
    dns_lookup_function_00._M_invoker = in_stack_fffffffffffffd80;
    LookupHost((optional<CNetAddr> *)local_a0,(string *)local_78,false,dns_lookup_function_00);
    if (local_80 == false) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        std::__throw_bad_optional_access();
      }
    }
    else {
      CNetAddr::operator=(&addr,(CNetAddr *)local_a0);
      std::_Optional_payload_base<CNetAddr>::_M_reset((_Optional_payload_base<CNetAddr> *)local_a0);
      std::_Function_base::~_Function_base(&local_170.super__Function_base);
      std::__cxx11::string::~string((string *)local_78);
      local_a0._0_8_ = &ser_params;
      local_a0._8_8_ = &addr;
      ParamsWrapper<CAddress::SerParams,_CNetAddr>::Serialize<DataStream>
                ((ParamsWrapper<CAddress::SerParams,_CNetAddr> *)local_a0,&local_c8);
      local_180 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
      local_178 = "";
      local_190 = &boost::unit_test::basic_cstring<char_const>::null;
      local_188 = &boost::unit_test::basic_cstring<char_const>::null;
      file_01.m_end = (iterator)0x15a;
      file_01.m_begin = (iterator)&local_180;
      msg_01.m_end = pvVar4;
      msg_01.m_begin = pvVar3;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_190,
                 msg_01);
      local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
      local_a0._0_8_ = &PTR__lazy_ostream_011480b0;
      local_a0._16_8_ = boost::unit_test::lazy_ostream::inst;
      local_a0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
      local_1a0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
      local_198 = "";
      s_01.m_data = local_c8.vch.
                    super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start + local_c8.m_read_pos;
      s_01.m_size = (long)local_c8.vch.
                          super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)s_01.m_data;
      HexStr_abi_cxx11_((string *)local_78,s_01);
      pvVar3 = (iterator)0x2;
      pvVar4 = local_78;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[33]>
                (local_a0,&local_1a0,0x15a,1,2,pvVar4,"HexStr(s)","1a1b2a2b3a3b4a4b5a5b6a6b7a7b8a8b"
                 ,"\"1a1b2a2b3a3b4a4b5a5b6a6b7a7b8a8b\"");
      std::__cxx11::string::~string((string *)local_78);
      if (local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      local_c8.m_read_pos = 0;
      local_1b0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
      local_1a8 = "";
      local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_02.m_end = (iterator)0x15e;
      file_02.m_begin = (iterator)&local_1b0;
      msg_02.m_end = pvVar4;
      msg_02.m_begin = pvVar3;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1c0,
                 msg_02);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_a0,"6hzph5hv6337r6p2.onion",&local_1d9);
      _cVar5 = 0x3ecc03;
      bVar2 = CNetAddr::SetSpecial(&addr,(string *)local_a0);
      local_1d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)!bVar2;
      local_1d8.m_message.px = (element_type *)0x0;
      local_1d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_1f0 = "!addr.SetSpecial(\"6hzph5hv6337r6p2.onion\")";
      local_1e8 = "";
      local_78[8] = false;
      local_78._0_8_ = &PTR__lazy_ostream_011481f0;
      local_68 = boost::unit_test::lazy_ostream::inst;
      local_200 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
      local_1f8 = "";
      pvVar4 = &DAT_00000001;
      pvVar3 = (iterator)0x0;
      local_60 = &local_1f0;
      boost::test_tools::tt_detail::report_assertion
                (&local_1d8,(lazy_ostream *)local_78,1,0,WARN,_cVar5,(size_t)&local_200,0x15e);
      boost::detail::shared_count::~shared_count(&local_1d8.m_message.pn);
      std::__cxx11::string::~string((string *)local_a0);
      local_210 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
      local_208 = "";
      local_220 = &boost::unit_test::basic_cstring<char_const>::null;
      local_218 = &boost::unit_test::basic_cstring<char_const>::null;
      file_03.m_end = (iterator)0x160;
      file_03.m_begin = (iterator)&local_210;
      msg_03.m_end = pvVar3;
      msg_03.m_begin = pvVar4;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_220,
                 msg_03);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_a0,"pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd.onion"
                 ,&local_1d9);
      _cVar5 = 0x3eccff;
      local_1d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)CNetAddr::SetSpecial(&addr,(string *)local_a0);
      local_1d8.m_message.px = (element_type *)0x0;
      local_1d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_1f0 = 
      "addr.SetSpecial(\"pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd.onion\")";
      local_1e8 = "";
      local_78[8] = false;
      local_78._0_8_ = &PTR__lazy_ostream_011481f0;
      local_68 = boost::unit_test::lazy_ostream::inst;
      local_230 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
      local_228 = "";
      pvVar4 = (iterator)0x2;
      pvVar3 = (iterator)0x0;
      local_60 = &local_1f0;
      boost::test_tools::tt_detail::report_assertion
                (&local_1d8,(lazy_ostream *)local_78,2,0,WARN,_cVar5,(size_t)&local_230,0x160);
      boost::detail::shared_count::~shared_count(&local_1d8.m_message.pn);
      std::__cxx11::string::~string((string *)local_a0);
      local_a0._0_8_ = &ser_params;
      local_a0._8_8_ = &addr;
      ParamsWrapper<CAddress::SerParams,_CNetAddr>::Serialize<DataStream>
                ((ParamsWrapper<CAddress::SerParams,_CNetAddr> *)local_a0,&local_c8);
      local_240 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
      local_238 = "";
      local_250 = &boost::unit_test::basic_cstring<char_const>::null;
      local_248 = &boost::unit_test::basic_cstring<char_const>::null;
      file_04.m_end = (iterator)0x162;
      file_04.m_begin = (iterator)&local_240;
      msg_04.m_end = pvVar3;
      msg_04.m_begin = pvVar4;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_250,
                 msg_04);
      local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
      local_a0._0_8_ = &PTR__lazy_ostream_011480b0;
      local_a0._16_8_ = boost::unit_test::lazy_ostream::inst;
      local_a0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
      local_260 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
      local_258 = "";
      s_02.m_data = local_c8.vch.
                    super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start + local_c8.m_read_pos;
      s_02.m_size = (long)local_c8.vch.
                          super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)s_02.m_data;
      HexStr_abi_cxx11_((string *)local_78,s_02);
      pvVar3 = (iterator)0x2;
      pvVar4 = local_78;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[33]>
                (local_a0,&local_260,0x162,1,2,pvVar4,"HexStr(s)","00000000000000000000000000000000"
                 ,"\"00000000000000000000000000000000\"");
      std::__cxx11::string::~string((string *)local_78);
      if (local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      local_c8.m_read_pos = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_a0,"a",(allocator<char> *)local_78);
      CNetAddr::SetInternal(&addr,(string *)local_a0);
      std::__cxx11::string::~string((string *)local_a0);
      local_a0._0_8_ = &ser_params;
      local_a0._8_8_ = &addr;
      ParamsWrapper<CAddress::SerParams,_CNetAddr>::Serialize<DataStream>
                ((ParamsWrapper<CAddress::SerParams,_CNetAddr> *)local_a0,&local_c8);
      local_270 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
      local_268 = "";
      file_05.m_end = (iterator)0x167;
      file_05.m_begin = (iterator)&local_270;
      msg_05.m_end = pvVar4;
      msg_05.m_begin = pvVar3;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,
                 (size_t)&stack0xfffffffffffffd80,msg_05);
      local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
      local_a0._0_8_ = &PTR__lazy_ostream_011480b0;
      local_a0._16_8_ = boost::unit_test::lazy_ostream::inst;
      local_a0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
      s_03.m_data = local_c8.vch.
                    super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start + local_c8.m_read_pos;
      s_03.m_size = (long)local_c8.vch.
                          super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)s_03.m_data;
      HexStr_abi_cxx11_((string *)local_78,s_03);
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[33]>
                (local_a0,&stack0xfffffffffffffd70,0x167,1,2,local_78,"HexStr(s)",
                 "fd6b88c08724ca978112ca1bbdcafac2","\"fd6b88c08724ca978112ca1bbdcafac2\"");
      std::__cxx11::string::~string((string *)local_78);
      if (local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      local_c8.m_read_pos = 0;
      std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_c8);
      prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&addr.m_addr);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(cnetaddr_serialize_v1)
{
    CNetAddr addr;
    DataStream s{};
    const auto ser_params{CAddress::V1_NETWORK};

    s << ser_params(addr);
    BOOST_CHECK_EQUAL(HexStr(s), "00000000000000000000000000000000");
    s.clear();

    addr = LookupHost("1.2.3.4", false).value();
    s << ser_params(addr);
    BOOST_CHECK_EQUAL(HexStr(s), "00000000000000000000ffff01020304");
    s.clear();

    addr = LookupHost("1a1b:2a2b:3a3b:4a4b:5a5b:6a6b:7a7b:8a8b", false).value();
    s << ser_params(addr);
    BOOST_CHECK_EQUAL(HexStr(s), "1a1b2a2b3a3b4a4b5a5b6a6b7a7b8a8b");
    s.clear();

    // TORv2, no longer supported
    BOOST_CHECK(!addr.SetSpecial("6hzph5hv6337r6p2.onion"));

    BOOST_REQUIRE(addr.SetSpecial("pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd.onion"));
    s << ser_params(addr);
    BOOST_CHECK_EQUAL(HexStr(s), "00000000000000000000000000000000");
    s.clear();

    addr.SetInternal("a");
    s << ser_params(addr);
    BOOST_CHECK_EQUAL(HexStr(s), "fd6b88c08724ca978112ca1bbdcafac2");
    s.clear();
}